

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  __m128i *palVar38;
  __m128i *palVar39;
  __m128i *palVar40;
  __m128i *palVar41;
  __m128i *palVar42;
  __m128i *palVar43;
  __m128i *palVar44;
  __m128i *palVar45;
  int iVar46;
  int iVar47;
  __m128i *ptr;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  int32_t *ptr_00;
  __m128i *palVar48;
  undefined8 *puVar49;
  uint uVar50;
  int iVar51;
  int iVar52;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  int32_t in_R9D;
  uint uVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  uint uVar59;
  uint uVar60;
  int iVar61;
  int iVar62;
  ulong uVar58;
  uint uVar63;
  uint uVar64;
  int iVar65;
  int iVar66;
  uint uVar68;
  uint uVar69;
  int iVar70;
  int iVar71;
  ulong uVar67;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  __m128i alVar78;
  __m128i alVar79;
  __m128i alVar80;
  __m128i alVar81;
  __m128i alVar82;
  __m128i c;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  __m128i vH_04;
  __m128i vH_05;
  __m128i vH_06;
  __m128i vH_07;
  int32_t in_stack_ffffffffffffef88;
  int local_1070;
  int local_1068;
  long local_1060;
  int local_1058;
  int local_104c;
  ulong uStack_1048;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  __m128i cond;
  __m128i case2_1;
  __m128i case1_1;
  int32_t tmp2;
  int64_t tmp_6;
  __m128i vHp;
  __m128i case2;
  __m128i case1;
  __m128i *tmp_5;
  __m128i *tmp_4;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *vPS;
  __m128i *vPM;
  __m128i *vP;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_32_t e;
  __m128i_32_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int32_t length;
  int32_t similar;
  int32_t matches;
  int32_t score;
  __m128i vOne;
  __m128i vZero;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int32_t *boundary;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvHLLoad;
  __m128i *pvHLStore;
  __m128i *pvHSLoad;
  __m128i *pvHSStore;
  __m128i *pvHMLoad;
  __m128i *pvHMStore;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfileS;
  __m128i *vProfileM;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_cd8;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_9b8;
  int iStack_9b4;
  int iStack_9b0;
  int iStack_9ac;
  int local_9a8;
  int iStack_9a4;
  int iStack_9a0;
  int iStack_99c;
  int local_998;
  int iStack_994;
  int iStack_990;
  int iStack_98c;
  int local_958;
  int iStack_954;
  int iStack_950;
  int iStack_94c;
  int local_918;
  int iStack_914;
  int iStack_910;
  int iStack_90c;
  int local_8f8;
  int iStack_8f4;
  int iStack_8f0;
  int iStack_8ec;
  int local_8e8;
  int iStack_8e4;
  int iStack_8e0;
  int iStack_8dc;
  int local_8d8;
  int iStack_8d4;
  int iStack_8d0;
  int iStack_8cc;
  int local_8c8;
  int iStack_8c4;
  int iStack_8c0;
  int iStack_8bc;
  int local_8b8;
  int iStack_8b4;
  int iStack_8b0;
  int iStack_8ac;
  int local_8a8;
  int iStack_8a4;
  int iStack_8a0;
  int iStack_89c;
  int local_898;
  int iStack_894;
  int iStack_890;
  int iStack_88c;
  int local_888;
  int iStack_884;
  int iStack_880;
  int iStack_87c;
  int local_868;
  int iStack_864;
  int iStack_860;
  int iStack_85c;
  int local_848;
  int iStack_844;
  int iStack_840;
  int iStack_83c;
  int local_818;
  int iStack_814;
  int iStack_810;
  int iStack_80c;
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  int local_7f8;
  int iStack_7f4;
  int iStack_7f0;
  int iStack_7ec;
  int local_7a8;
  int iStack_7a4;
  int iStack_7a0;
  int iStack_79c;
  int local_788;
  int iStack_784;
  int iStack_780;
  int iStack_77c;
  int local_768;
  int iStack_764;
  int iStack_760;
  int iStack_75c;
  int local_738;
  int iStack_734;
  int iStack_730;
  int iStack_72c;
  uint local_728;
  uint uStack_724;
  uint uStack_720;
  uint uStack_71c;
  int local_708;
  int iStack_704;
  int iStack_700;
  int iStack_6fc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  ulong uStack_f0;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  size_t len;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_striped_profile_sse41_128_32",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_striped_profile_sse41_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_striped_profile_sse41_128_32",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_table_striped_profile_sse41_128_32",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_striped_profile_sse41_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_table_striped_profile_sse41_128_32",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_table_striped_profile_sse41_128_32",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_table_striped_profile_sse41_128_32",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_cd8 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    iVar46 = (iVar1 + 3) / 4;
    iVar52 = (iVar1 + -1) % iVar46;
    pvVar3 = (profile->profile32).score;
    pvVar4 = (profile->profile32).matches;
    pvVar5 = (profile->profile32).similar;
    if (-open < ppVar2->min) {
      local_104c = open + -0x80000000;
    }
    else {
      local_104c = -0x80000000 - ppVar2->min;
    }
    local_104c = local_104c + 1;
    iVar47 = 0x7ffffffe - ppVar2->max;
    vSaturationCheckMax[1] = CONCAT44(iVar47,iVar47);
    vSaturationCheckMin[0] = CONCAT44(iVar47,iVar47);
    result = (parasail_result_t *)CONCAT44(local_104c,local_104c);
    vSaturationCheckMax[0] = CONCAT44(local_104c,local_104c);
    _segNum = (parasail_profile_t *)parasail_result_new_table3(iVar46 * 4,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x4410801;
      uVar50 = *(uint *)&_segNum->field_0xc | 0x20000;
      len = (size_t)uVar50;
      *(uint *)&_segNum->field_0xc = uVar50;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar46);
      pvHMStore = parasail_memalign___m128i(0x10,(long)iVar46);
      pvHMLoad = parasail_memalign___m128i(0x10,(long)iVar46);
      pvHSStore = parasail_memalign___m128i(0x10,(long)iVar46);
      pvHSLoad = parasail_memalign___m128i(0x10,(long)iVar46);
      pvHLStore = parasail_memalign___m128i(0x10,(long)iVar46);
      pvHLLoad = parasail_memalign___m128i(0x10,(long)iVar46);
      pvE = parasail_memalign___m128i(0x10,(long)iVar46);
      ptr = parasail_memalign___m128i(0x10,(long)iVar46);
      b = parasail_memalign___m128i(0x10,(long)iVar46);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar46);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar46);
      ptr_00 = parasail_memalign_int32_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar78[0] = (long)iVar46;
        alVar78[1] = extraout_RDX;
        parasail_memset___m128i(pvHMLoad,alVar78,len);
        alVar79[0] = (long)iVar46;
        alVar79[1] = extraout_RDX_00;
        parasail_memset___m128i(pvHSLoad,alVar79,len);
        alVar80[0] = (long)iVar46;
        alVar80[1] = extraout_RDX_01;
        parasail_memset___m128i(pvHLLoad,alVar80,len);
        alVar81[0] = (long)iVar46;
        alVar81[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar81,len);
        alVar82[0] = (long)iVar46;
        alVar82[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,alVar82,len);
        c[0] = (long)iVar46;
        c[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,c,len);
        h.v[3] = 0;
        for (k = 0; k < iVar46; k = k + 1) {
          for (h.v[2] = 0; h.v[2] < 4; h.v[2] = h.v[2] + 1) {
            local_1058 = -(gap * (h.v[2] * iVar46 + k)) - open;
            local_1060 = (long)local_1058;
            if (local_1060 < -0x80000000) {
              local_1058 = -0x80000000;
            }
            *(int *)((long)&e + (long)h.v[2] * 4 + 8) = local_1058;
            local_1060 = local_1060 - open;
            if (local_1060 < -0x80000000) {
              local_1060 = -0x80000000;
            }
            *(int *)((long)&tmp + (long)h.v[2] * 4) = (int)local_1060;
          }
          pvHLoad[h.v[3]][0] = e.m[1];
          pvHLoad[h.v[3]][1] = h.m[0];
          ptr[h.v[3]][0] = tmp;
          ptr[h.v[3]][1] = e.m[0];
          h.v[3] = h.v[3] + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          local_1068 = -(gap * (k + -1)) - open;
          if (local_1068 < -0x80000000) {
            local_1068 = -0x80000000;
          }
          ptr_00[k] = local_1068;
        }
        for (s1Len = 0; palVar45 = pvHLoad, palVar44 = pvHMStore, palVar43 = pvHMLoad,
            palVar42 = pvHSStore, palVar41 = pvHSLoad, palVar40 = pvHLStore, palVar39 = pvHLLoad,
            palVar38 = pvE, s1Len < s2Len; s1Len = s1Len + 1) {
          stack0xfffffffffffff118 = ZEXT816(0);
          stack0xfffffffffffff108 = ZEXT816(0);
          vFL[0] = 0x100000001;
          vH[1] = 0x100000001;
          uVar58 = pvHLoad[iVar46 + -1][0];
          uVar67 = pvHMLoad[iVar46 + -1][0];
          uVar6 = pvHSLoad[iVar46 + -1][0];
          uVar7 = pvHLLoad[iVar46 + -1][0];
          vH[0] = pvHLoad[iVar46 + -1][1] << 0x20 | uVar58 >> 0x20;
          vHM[0] = pvHMLoad[iVar46 + -1][1] << 0x20 | uVar67 >> 0x20;
          vHS[1] = uVar67 << 0x20;
          vHS[0] = pvHSLoad[iVar46 + -1][1] << 0x20 | uVar6 >> 0x20;
          vHL[1] = uVar6 << 0x20;
          vHL[0] = pvHLLoad[iVar46 + -1][1] << 0x20 | uVar7 >> 0x20;
          vP = (__m128i *)(uVar7 << 0x20);
          vH_dag[1] = uVar58 << 0x20 | (ulong)(uint)ptr_00[s1Len];
          iVar51 = ppVar2->mapper[(byte)s2[s1Len]] * iVar46;
          iVar56 = ppVar2->mapper[(byte)s2[s1Len]];
          iVar57 = ppVar2->mapper[(byte)s2[s1Len]];
          pvHMStore = pvHLoad;
          pvHLoad = palVar44;
          pvHSStore = pvHMLoad;
          pvHMLoad = palVar42;
          pvHLStore = pvHSLoad;
          pvHSLoad = palVar40;
          pvE = pvHLLoad;
          pvHLLoad = palVar38;
          vF_ext[1] = (longlong)CONCAT44(local_104c,local_104c);
          vF[0] = CONCAT44(local_104c,local_104c);
          for (k = 0; k < iVar46; k = k + 1) {
            lVar8 = ptr[k][0];
            lVar9 = ptr[k][1];
            alVar81 = b[k];
            alVar78 = b[k];
            alVar82 = b_00[k];
            alVar79 = b_00[k];
            palVar48 = b_01 + k;
            lVar10 = (*palVar48)[0];
            lVar11 = (*palVar48)[1];
            alVar80 = *palVar48;
            puVar49 = (undefined8 *)((long)pvVar3 + (long)k * 0x10 + (long)iVar51 * 0x10);
            uVar12 = *puVar49;
            uVar13 = puVar49[1];
            local_898 = (int)vH_dag[1];
            iStack_894 = (int)((ulong)vH_dag[1] >> 0x20);
            iStack_890 = (int)vH[0];
            iStack_88c = (int)((ulong)vH[0] >> 0x20);
            local_8a8 = (int)uVar12;
            iStack_8a4 = (int)((ulong)uVar12 >> 0x20);
            iStack_8a0 = (int)uVar13;
            iStack_89c = (int)((ulong)uVar13 >> 0x20);
            uVar50 = local_898 + local_8a8;
            uVar59 = iStack_894 + iStack_8a4;
            uVar63 = iStack_890 + iStack_8a0;
            uVar68 = iStack_88c + iStack_89c;
            local_708 = (int)lVar8;
            iStack_704 = (int)((ulong)lVar8 >> 0x20);
            iStack_700 = (int)lVar9;
            iStack_6fc = (int)((ulong)lVar9 >> 0x20);
            uVar53 = (uint)((int)uVar50 < local_708) * local_708 |
                     ((int)uVar50 >= local_708) * uVar50;
            uVar60 = (uint)((int)uVar59 < iStack_704) * iStack_704 |
                     ((int)uVar59 >= iStack_704) * uVar59;
            uVar64 = (uint)((int)uVar63 < iStack_700) * iStack_700 |
                     ((int)uVar63 >= iStack_700) * uVar63;
            uVar69 = (uint)((int)uVar68 < iStack_6fc) * iStack_6fc |
                     ((int)uVar68 >= iStack_6fc) * uVar68;
            local_728 = (uint)vF_ext[1];
            uStack_724 = (uint)((ulong)vF_ext[1] >> 0x20);
            uStack_720 = (uint)vF[0];
            uStack_71c = (uint)((ulong)vF[0] >> 0x20);
            uVar53 = ((int)uVar53 < (int)local_728) * local_728 |
                     ((int)uVar53 >= (int)local_728) * uVar53;
            uVar60 = ((int)uVar60 < (int)uStack_724) * uStack_724 |
                     ((int)uVar60 >= (int)uStack_724) * uVar60;
            uVar64 = ((int)uVar64 < (int)uStack_720) * uStack_720 |
                     ((int)uVar64 >= (int)uStack_720) * uVar64;
            uVar69 = ((int)uVar69 < (int)uStack_71c) * uStack_71c |
                     ((int)uVar69 >= (int)uStack_71c) * uVar69;
            vH_dag[1] = CONCAT44(uVar60,uVar53);
            vH[0] = CONCAT44(uVar69,uVar64);
            palVar44[k][0] = vH_dag[1];
            palVar44[k][1] = vH[0];
            iVar54 = -(uint)(uVar53 == uVar50);
            iVar61 = -(uint)(uVar60 == uVar59);
            iVar65 = -(uint)(uVar64 == uVar63);
            iVar70 = -(uint)(uVar69 == uVar68);
            iVar55 = -(uint)(uVar53 == local_728);
            iVar62 = -(uint)(uVar60 == uStack_724);
            iVar66 = -(uint)(uVar64 == uStack_720);
            iVar71 = -(uint)(uVar69 == uStack_71c);
            auVar35._4_4_ = iVar62;
            auVar35._0_4_ = iVar55;
            auVar35._12_4_ = iVar71;
            auVar35._8_4_ = iVar66;
            auVar75 = pblendvb((undefined1  [16])alVar78,stack0xfffffffffffff118,auVar35);
            puVar49 = (undefined8 *)((long)pvVar4 + (long)k * 0x10 + (long)(iVar56 * iVar46) * 0x10)
            ;
            uVar12 = *puVar49;
            uVar13 = puVar49[1];
            local_8b8 = (int)vHS[1];
            iStack_8b4 = vHS[1]._4_4_;
            iStack_8b0 = (int)vHS[2];
            iStack_8ac = vHS[2]._4_4_;
            local_8c8 = (int)uVar12;
            iStack_8c4 = (int)((ulong)uVar12 >> 0x20);
            iStack_8c0 = (int)uVar13;
            iStack_8bc = (int)((ulong)uVar13 >> 0x20);
            auVar33._4_4_ = iVar61;
            auVar33._0_4_ = iVar54;
            auVar33._12_4_ = iVar70;
            auVar33._8_4_ = iVar65;
            auVar34._4_4_ = iStack_8b4 + iStack_8c4;
            auVar34._0_4_ = local_8b8 + local_8c8;
            auVar34._8_4_ = iStack_8b0 + iStack_8c0;
            auVar34._12_4_ = iStack_8ac + iStack_8bc;
            auVar75 = pblendvb(auVar75,auVar34,auVar33);
            vHS[1] = auVar75._0_8_;
            vHM[0] = auVar75._8_8_;
            palVar42[k][0] = vHS[1];
            palVar42[k][1] = vHM[0];
            auVar32._4_4_ = iVar62;
            auVar32._0_4_ = iVar55;
            auVar32._12_4_ = iVar71;
            auVar32._8_4_ = iVar66;
            auVar76 = pblendvb((undefined1  [16])alVar79,stack0xfffffffffffff108,auVar32);
            puVar49 = (undefined8 *)((long)pvVar5 + (long)k * 0x10 + (long)(iVar57 * iVar46) * 0x10)
            ;
            uVar12 = *puVar49;
            uVar13 = puVar49[1];
            local_8d8 = (int)vHL[1];
            iStack_8d4 = vHL[1]._4_4_;
            iStack_8d0 = (int)vHL[2];
            iStack_8cc = vHL[2]._4_4_;
            local_8e8 = (int)uVar12;
            iStack_8e4 = (int)((ulong)uVar12 >> 0x20);
            iStack_8e0 = (int)uVar13;
            iStack_8dc = (int)((ulong)uVar13 >> 0x20);
            auVar30._4_4_ = iVar61;
            auVar30._0_4_ = iVar54;
            auVar30._12_4_ = iVar70;
            auVar30._8_4_ = iVar65;
            auVar31._4_4_ = iStack_8d4 + iStack_8e4;
            auVar31._0_4_ = local_8d8 + local_8e8;
            auVar31._8_4_ = iStack_8d0 + iStack_8e0;
            auVar31._12_4_ = iStack_8cc + iStack_8dc;
            auVar76 = pblendvb(auVar76,auVar31,auVar30);
            vHL[1] = auVar76._0_8_;
            vHS[0] = auVar76._8_8_;
            palVar40[k][0] = vHL[1];
            palVar40[k][1] = vHS[0];
            auVar29._4_4_ = iVar62;
            auVar29._0_4_ = iVar55;
            auVar29._12_4_ = iVar71;
            auVar29._8_4_ = iVar66;
            auVar77 = pblendvb((undefined1  [16])alVar80,stack0xfffffffffffff0f8,auVar29);
            local_8f8 = (int)vP;
            iStack_8f4 = vP._4_4_;
            iStack_8f0 = vP._8_4_;
            iStack_8ec = vP._12_4_;
            auVar27._4_4_ = iVar61;
            auVar27._0_4_ = iVar54;
            auVar27._12_4_ = iVar70;
            auVar27._8_4_ = iVar65;
            auVar28._4_4_ = iStack_8f4 + 1;
            auVar28._0_4_ = local_8f8 + 1;
            auVar28._8_4_ = iStack_8f0 + 1;
            auVar28._12_4_ = iStack_8ec + 1;
            auVar77 = pblendvb(auVar77,auVar28,auVar27);
            vP = auVar77._0_8_;
            vHL[0] = auVar77._8_8_;
            palVar38[k][0] = (longlong)vP;
            palVar38[k][1] = vHL[0];
            local_2b8 = (int)vSaturationCheckMax[1];
            iStack_2b4 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
            iStack_2b0 = (int)vSaturationCheckMin[0];
            iStack_2ac = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
            vSaturationCheckMax[1] =
                 CONCAT44(((int)uVar60 < iStack_2b4) * uVar60 |
                          (uint)((int)uVar60 >= iStack_2b4) * iStack_2b4,
                          ((int)uVar53 < local_2b8) * uVar53 |
                          (uint)((int)uVar53 >= local_2b8) * local_2b8);
            vSaturationCheckMin[0] =
                 CONCAT44(((int)uVar69 < iStack_2ac) * uVar69 |
                          (uint)((int)uVar69 >= iStack_2ac) * iStack_2ac,
                          ((int)uVar64 < iStack_2b0) * uVar64 |
                          (uint)((int)uVar64 >= iStack_2b0) * iStack_2b0);
            local_738 = (int)result;
            iStack_734 = (int)((ulong)result >> 0x20);
            iStack_730 = (int)vSaturationCheckMax[0];
            iStack_72c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
            uVar50 = (local_738 < (int)uVar53) * uVar53 |
                     (uint)(local_738 >= (int)uVar53) * local_738;
            uVar59 = (iStack_734 < (int)uVar60) * uVar60 |
                     (uint)(iStack_734 >= (int)uVar60) * iStack_734;
            uVar63 = (iStack_730 < (int)uVar64) * uVar64 |
                     (uint)(iStack_730 >= (int)uVar64) * iStack_730;
            uVar68 = (iStack_72c < (int)uVar69) * uVar69 |
                     (uint)(iStack_72c >= (int)uVar69) * iStack_72c;
            local_768 = auVar75._0_4_;
            iStack_764 = auVar75._4_4_;
            iStack_760 = auVar75._8_4_;
            iStack_75c = auVar75._12_4_;
            uVar50 = (uint)((int)uVar50 < local_768) * local_768 |
                     ((int)uVar50 >= local_768) * uVar50;
            uVar59 = (uint)((int)uVar59 < iStack_764) * iStack_764 |
                     ((int)uVar59 >= iStack_764) * uVar59;
            uVar63 = (uint)((int)uVar63 < iStack_760) * iStack_760 |
                     ((int)uVar63 >= iStack_760) * uVar63;
            uVar68 = (uint)((int)uVar68 < iStack_75c) * iStack_75c |
                     ((int)uVar68 >= iStack_75c) * uVar68;
            local_788 = auVar76._0_4_;
            iStack_784 = auVar76._4_4_;
            iStack_780 = auVar76._8_4_;
            iStack_77c = auVar76._12_4_;
            uVar50 = (uint)((int)uVar50 < local_788) * local_788 |
                     ((int)uVar50 >= local_788) * uVar50;
            uVar59 = (uint)((int)uVar59 < iStack_784) * iStack_784 |
                     ((int)uVar59 >= iStack_784) * uVar59;
            uVar63 = (uint)((int)uVar63 < iStack_780) * iStack_780 |
                     ((int)uVar63 >= iStack_780) * uVar63;
            uVar68 = (uint)((int)uVar68 < iStack_77c) * iStack_77c |
                     ((int)uVar68 >= iStack_77c) * uVar68;
            local_7a8 = auVar77._0_4_;
            iStack_7a4 = auVar77._4_4_;
            iStack_7a0 = auVar77._8_4_;
            iStack_79c = auVar77._12_4_;
            result = (parasail_result_t *)
                     CONCAT44((uint)((int)uVar59 < iStack_7a4) * iStack_7a4 |
                              ((int)uVar59 >= iStack_7a4) * uVar59,
                              (uint)((int)uVar50 < local_7a8) * local_7a8 |
                              ((int)uVar50 >= local_7a8) * uVar50);
            vSaturationCheckMax[0] =
                 CONCAT44((uint)((int)uVar68 < iStack_79c) * iStack_79c |
                          ((int)uVar68 >= iStack_79c) * uVar68,
                          (uint)((int)uVar63 < iStack_7a0) * iStack_7a0 |
                          ((int)uVar63 >= iStack_7a0) * uVar63);
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar46;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &_segNum->matrix)->trace->trace_del_table + 8),vH_00,
                            s1Len,s2Len,in_R9D,in_stack_ffffffffffffef88);
            vH_01[0] = (ulong)(uint)k;
            vH_01[1]._0_4_ = iVar46;
            vH_01[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &_segNum->matrix)->trace->trace_del_table + 0x10),vH_01,
                            s1Len,s2Len,in_R9D,in_stack_ffffffffffffef88);
            vH_02[0] = (ulong)(uint)k;
            vH_02[1]._0_4_ = iVar46;
            vH_02[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &_segNum->matrix)->trace->trace_del_table + 0x18),vH_02,
                            s1Len,s2Len,in_R9D,in_stack_ffffffffffffef88);
            vH_03[0] = (ulong)(uint)k;
            vH_03[1]._0_4_ = iVar46;
            vH_03[1]._4_4_ = 0;
            arr_store_si128(*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                             trace->trace_del_table,vH_03,s1Len,s2Len,in_R9D,
                            in_stack_ffffffffffffef88);
            iVar54 = uVar53 - open;
            iVar61 = uVar60 - open;
            iVar65 = uVar64 - open;
            iVar70 = uVar69 - open;
            local_708 = local_708 - gap;
            iStack_704 = iStack_704 - gap;
            iStack_700 = iStack_700 - gap;
            iStack_6fc = iStack_6fc - gap;
            vE_ext[1] = CONCAT44((uint)(iVar61 < iStack_704) * iStack_704 |
                                 (uint)(iVar61 >= iStack_704) * iVar61,
                                 (uint)(iVar54 < local_708) * local_708 |
                                 (uint)(iVar54 >= local_708) * iVar54);
            vE[0] = CONCAT44((uint)(iVar70 < iStack_6fc) * iStack_6fc |
                             (uint)(iVar70 >= iStack_6fc) * iVar70,
                             (uint)(iVar65 < iStack_700) * iStack_700 |
                             (uint)(iVar65 >= iStack_700) * iVar65);
            iVar55 = -(uint)(local_708 < iVar54);
            iVar62 = -(uint)(iStack_704 < iVar61);
            iVar66 = -(uint)(iStack_700 < iVar65);
            iVar71 = -(uint)(iStack_6fc < iVar70);
            auVar26._4_4_ = iVar62;
            auVar26._0_4_ = iVar55;
            auVar26._12_4_ = iVar71;
            auVar26._8_4_ = iVar66;
            auVar77 = pblendvb((undefined1  [16])alVar81,auVar75,auVar26);
            auVar25._4_4_ = iVar62;
            auVar25._0_4_ = iVar55;
            auVar25._12_4_ = iVar71;
            auVar25._8_4_ = iVar66;
            auVar72 = pblendvb((undefined1  [16])alVar82,auVar76,auVar25);
            local_918 = (int)lVar10;
            iStack_914 = (int)((ulong)lVar10 >> 0x20);
            iStack_910 = (int)lVar11;
            iStack_90c = (int)((ulong)lVar11 >> 0x20);
            auVar22._4_4_ = iVar62;
            auVar22._0_4_ = iVar55;
            auVar22._12_4_ = iVar71;
            auVar22._8_4_ = iVar66;
            auVar24._4_4_ = iStack_914 + 1;
            auVar24._0_4_ = local_918 + 1;
            auVar24._8_4_ = iStack_910 + 1;
            auVar24._12_4_ = iStack_90c + 1;
            auVar23._4_4_ = iStack_7a4 + 1;
            auVar23._0_4_ = local_7a8 + 1;
            auVar23._8_4_ = iStack_7a0 + 1;
            auVar23._12_4_ = iStack_79c + 1;
            auVar73 = pblendvb(auVar24,auVar23,auVar22);
            ptr[k][0] = vE_ext[1];
            ptr[k][1] = vE[0];
            vES[1] = auVar77._0_8_;
            vEM[0] = auVar77._8_8_;
            b[k][0] = vES[1];
            b[k][1] = vEM[0];
            vEL[1] = auVar72._0_8_;
            vES[0] = auVar72._8_8_;
            b_00[k][0] = vEL[1];
            b_00[k][1] = vES[0];
            vF[1] = auVar73._0_8_;
            vEL[0] = auVar73._8_8_;
            b_01[k][0] = vF[1];
            b_01[k][1] = vEL[0];
            iVar55 = local_728 - gap;
            iVar62 = uStack_724 - gap;
            iVar66 = uStack_720 - gap;
            iVar71 = uStack_71c - gap;
            vF_ext[1] = CONCAT44((uint)(iVar61 < iVar62) * iVar62 |
                                 (uint)(iVar61 >= iVar62) * iVar61,
                                 (uint)(iVar54 < iVar55) * iVar55 |
                                 (uint)(iVar54 >= iVar55) * iVar54);
            vF[0] = CONCAT44((uint)(iVar70 < iVar71) * iVar71 | (uint)(iVar70 >= iVar71) * iVar70,
                             (uint)(iVar65 < iVar66) * iVar66 | (uint)(iVar65 >= iVar66) * iVar65);
            iVar54 = -(uint)(iVar55 < iVar54);
            iVar55 = -(uint)(iVar62 < iVar61);
            iVar61 = -(uint)(iVar66 < iVar65);
            iVar62 = -(uint)(iVar71 < iVar70);
            auVar73._4_4_ = iVar55;
            auVar73._0_4_ = iVar54;
            auVar73._12_4_ = iVar62;
            auVar73._8_4_ = iVar61;
            register0x00001240 = pblendvb(stack0xfffffffffffff118,auVar75,auVar73);
            auVar72._4_4_ = iVar55;
            auVar72._0_4_ = iVar54;
            auVar72._12_4_ = iVar62;
            auVar72._8_4_ = iVar61;
            register0x00001240 = pblendvb(stack0xfffffffffffff108,auVar76,auVar72);
            local_958 = (int)vH[1];
            iStack_954 = vH[1]._4_4_;
            iStack_950 = (int)vH[2];
            iStack_94c = vH[2]._4_4_;
            auVar75._4_4_ = iVar55;
            auVar75._0_4_ = iVar54;
            auVar75._12_4_ = iVar62;
            auVar75._8_4_ = iVar61;
            auVar77._4_4_ = iStack_954 + 1;
            auVar77._0_4_ = local_958 + 1;
            auVar77._8_4_ = iStack_950 + 1;
            auVar77._12_4_ = iStack_94c + 1;
            auVar76._4_4_ = iStack_7a4 + 1;
            auVar76._0_4_ = local_7a8 + 1;
            auVar76._8_4_ = iStack_7a0 + 1;
            auVar76._12_4_ = iStack_79c + 1;
            register0x00001240 = pblendvb(auVar77,auVar76,auVar75);
            vH_dag[1] = palVar45[k][0];
            vH[0] = palVar45[k][1];
            unique0x10003dbb = palVar43[k];
            unique0x10003dcb = palVar41[k];
            _vP = palVar39[k];
          }
          for (end_query = 0; end_query < 4; end_query = end_query + 1) {
            uVar58 = palVar45[iVar46 + -1][0];
            local_1070 = ptr_00[s1Len + 1] - open;
            if (local_1070 < -0x80000000) {
              local_1070 = -0x80000000;
            }
            vHp[0] = palVar45[iVar46 + -1][1] << 0x20 | uVar58 >> 0x20;
            vF[0] = vF[0] << 0x20 | (ulong)vF_ext[1] >> 0x20;
            vFM[0] = vFM[0] << 0x20 | (ulong)vFS[1] >> 0x20;
            vFS[1] = vFS[1] << 0x20;
            vFS[0] = vFS[0] << 0x20 | (ulong)vFL[1] >> 0x20;
            vFL[1] = vFL[1] << 0x20;
            tmp_6 = CONCAT44((int)uVar58,ptr_00[s1Len]);
            vF_ext[1]._4_4_ = (undefined4)vF_ext[1];
            vF_ext[1] = CONCAT44(vF_ext[1]._4_4_,local_1070);
            vFL[0] = vFL[0] << 0x20 | (ulong)vH[1] >> 0x20;
            vH[1] = vH[1] << 0x20 | 1;
            for (k = 0; k < iVar46; k = k + 1) {
              puVar49 = (undefined8 *)((long)pvVar3 + (long)k * 0x10 + (long)iVar51 * 0x10);
              uVar12 = *puVar49;
              uVar13 = puVar49[1];
              local_998 = (int)tmp_6;
              iStack_994 = (int)((ulong)tmp_6 >> 0x20);
              iStack_990 = (int)vHp[0];
              iStack_98c = (int)((ulong)vHp[0] >> 0x20);
              local_9a8 = (int)uVar12;
              iStack_9a4 = (int)((ulong)uVar12 >> 0x20);
              iStack_9a0 = (int)uVar13;
              iStack_99c = (int)((ulong)uVar13 >> 0x20);
              lVar8 = palVar44[k][0];
              lVar9 = palVar44[k][1];
              local_7f8 = (int)lVar8;
              iStack_7f4 = (int)((ulong)lVar8 >> 0x20);
              iStack_7f0 = (int)lVar9;
              iStack_7ec = (int)((ulong)lVar9 >> 0x20);
              local_808 = (uint)vF_ext[1];
              uStack_804 = (uint)((ulong)vF_ext[1] >> 0x20);
              uStack_800 = (uint)vF[0];
              uStack_7fc = (uint)((ulong)vF[0] >> 0x20);
              uVar50 = (local_7f8 < (int)local_808) * local_808 |
                       (uint)(local_7f8 >= (int)local_808) * local_7f8;
              uVar59 = (iStack_7f4 < (int)uStack_804) * uStack_804 |
                       (uint)(iStack_7f4 >= (int)uStack_804) * iStack_7f4;
              uVar63 = (iStack_7f0 < (int)uStack_800) * uStack_800 |
                       (uint)(iStack_7f0 >= (int)uStack_800) * iStack_7f0;
              uVar68 = (iStack_7ec < (int)uStack_7fc) * uStack_7fc |
                       (uint)(iStack_7ec >= (int)uStack_7fc) * iStack_7ec;
              vH_dag[1] = CONCAT44(uVar59,uVar50);
              vH[0] = CONCAT44(uVar68,uVar63);
              palVar44[k][0] = vH_dag[1];
              palVar44[k][1] = vH[0];
              uVar58 = ~CONCAT44(-(uint)(uVar59 == iStack_994 + iStack_9a4),
                                 -(uint)(uVar50 == local_998 + local_9a8)) &
                       CONCAT44(-(uint)(uVar59 == uStack_804),-(uint)(uVar50 == local_808));
              uVar67 = ~CONCAT44(-(uint)(uVar68 == iStack_98c + iStack_99c),
                                 -(uint)(uVar63 == iStack_990 + iStack_9a0)) &
                       CONCAT44(-(uint)(uVar68 == uStack_7fc),-(uint)(uVar63 == uStack_800));
              auVar21._8_8_ = uVar67;
              auVar21._0_8_ = uVar58;
              auVar75 = pblendvb((undefined1  [16])palVar42[k],stack0xfffffffffffff118,auVar21);
              vHS[1] = auVar75._0_8_;
              vHM[0] = auVar75._8_8_;
              palVar42[k][0] = vHS[1];
              palVar42[k][1] = vHM[0];
              auVar20._8_8_ = uVar67;
              auVar20._0_8_ = uVar58;
              auVar76 = pblendvb((undefined1  [16])palVar40[k],stack0xfffffffffffff108,auVar20);
              vHL[1] = auVar76._0_8_;
              vHS[0] = auVar76._8_8_;
              palVar40[k][0] = vHL[1];
              palVar40[k][1] = vHS[0];
              auVar19._8_8_ = uVar67;
              auVar19._0_8_ = uVar58;
              auVar77 = pblendvb((undefined1  [16])palVar38[k],stack0xfffffffffffff0f8,auVar19);
              vP = auVar77._0_8_;
              vHL[0] = auVar77._8_8_;
              palVar38[k][0] = (longlong)vP;
              palVar38[k][1] = vHL[0];
              local_2d8 = (int)vSaturationCheckMax[1];
              iStack_2d4 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
              iStack_2d0 = (int)vSaturationCheckMin[0];
              iStack_2cc = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
              vSaturationCheckMax[1] =
                   CONCAT44(((int)uVar59 < iStack_2d4) * uVar59 |
                            (uint)((int)uVar59 >= iStack_2d4) * iStack_2d4,
                            ((int)uVar50 < local_2d8) * uVar50 |
                            (uint)((int)uVar50 >= local_2d8) * local_2d8);
              vSaturationCheckMin[0] =
                   CONCAT44(((int)uVar68 < iStack_2cc) * uVar68 |
                            (uint)((int)uVar68 >= iStack_2cc) * iStack_2cc,
                            ((int)uVar63 < iStack_2d0) * uVar63 |
                            (uint)((int)uVar63 >= iStack_2d0) * iStack_2d0);
              local_818 = (int)result;
              iStack_814 = (int)((ulong)result >> 0x20);
              iStack_810 = (int)vSaturationCheckMax[0];
              iStack_80c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
              uVar53 = (local_818 < (int)uVar50) * uVar50 |
                       (uint)(local_818 >= (int)uVar50) * local_818;
              uVar60 = (iStack_814 < (int)uVar59) * uVar59 |
                       (uint)(iStack_814 >= (int)uVar59) * iStack_814;
              uVar64 = (iStack_810 < (int)uVar63) * uVar63 |
                       (uint)(iStack_810 >= (int)uVar63) * iStack_810;
              uVar69 = (iStack_80c < (int)uVar68) * uVar68 |
                       (uint)(iStack_80c >= (int)uVar68) * iStack_80c;
              local_848 = auVar75._0_4_;
              iStack_844 = auVar75._4_4_;
              iStack_840 = auVar75._8_4_;
              iStack_83c = auVar75._12_4_;
              uVar53 = (uint)((int)uVar53 < local_848) * local_848 |
                       ((int)uVar53 >= local_848) * uVar53;
              uVar60 = (uint)((int)uVar60 < iStack_844) * iStack_844 |
                       ((int)uVar60 >= iStack_844) * uVar60;
              uVar64 = (uint)((int)uVar64 < iStack_840) * iStack_840 |
                       ((int)uVar64 >= iStack_840) * uVar64;
              uVar69 = (uint)((int)uVar69 < iStack_83c) * iStack_83c |
                       ((int)uVar69 >= iStack_83c) * uVar69;
              local_868 = auVar76._0_4_;
              iStack_864 = auVar76._4_4_;
              iStack_860 = auVar76._8_4_;
              iStack_85c = auVar76._12_4_;
              uVar53 = (uint)((int)uVar53 < local_868) * local_868 |
                       ((int)uVar53 >= local_868) * uVar53;
              uVar60 = (uint)((int)uVar60 < iStack_864) * iStack_864 |
                       ((int)uVar60 >= iStack_864) * uVar60;
              uVar64 = (uint)((int)uVar64 < iStack_860) * iStack_860 |
                       ((int)uVar64 >= iStack_860) * uVar64;
              uVar69 = (uint)((int)uVar69 < iStack_85c) * iStack_85c |
                       ((int)uVar69 >= iStack_85c) * uVar69;
              local_888 = auVar77._0_4_;
              iStack_884 = auVar77._4_4_;
              iStack_880 = auVar77._8_4_;
              iStack_87c = auVar77._12_4_;
              result = (parasail_result_t *)
                       CONCAT44((uint)((int)uVar60 < iStack_884) * iStack_884 |
                                ((int)uVar60 >= iStack_884) * uVar60,
                                (uint)((int)uVar53 < local_888) * local_888 |
                                ((int)uVar53 >= local_888) * uVar53);
              vSaturationCheckMax[0] =
                   CONCAT44((uint)((int)uVar69 < iStack_87c) * iStack_87c |
                            ((int)uVar69 >= iStack_87c) * uVar69,
                            (uint)((int)uVar64 < iStack_880) * iStack_880 |
                            ((int)uVar64 >= iStack_880) * uVar64);
              vH_04[0] = (ulong)(uint)k;
              vH_04[1]._0_4_ = iVar46;
              vH_04[1]._4_4_ = 0;
              arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                              &_segNum->matrix)->trace->trace_del_table + 8),vH_04,
                              s1Len,s2Len,in_R9D,in_stack_ffffffffffffef88);
              vH_05[0] = (ulong)(uint)k;
              vH_05[1]._0_4_ = iVar46;
              vH_05[1]._4_4_ = 0;
              arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                              &_segNum->matrix)->trace->trace_del_table + 0x10),
                              vH_05,s1Len,s2Len,in_R9D,in_stack_ffffffffffffef88);
              vH_06[0] = (ulong)(uint)k;
              vH_06[1]._0_4_ = iVar46;
              vH_06[1]._4_4_ = 0;
              arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                              &_segNum->matrix)->trace->trace_del_table + 0x18),
                              vH_06,s1Len,s2Len,in_R9D,in_stack_ffffffffffffef88);
              vH_07[0] = (ulong)(uint)k;
              vH_07[1]._0_4_ = iVar46;
              vH_07[1]._4_4_ = 0;
              arr_store_si128(*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                               trace->trace_del_table,vH_07,s1Len,s2Len,in_R9D,
                              in_stack_ffffffffffffef88);
              iVar56 = uVar50 - open;
              iVar54 = uVar59 - open;
              iVar61 = uVar63 - open;
              iVar65 = uVar68 - open;
              iVar57 = local_808 - gap;
              iVar55 = uStack_804 - gap;
              iVar62 = uStack_800 - gap;
              iVar66 = uStack_7fc - gap;
              auVar74._0_8_ = CONCAT44(-(uint)(iVar54 < iVar55),-(uint)(iVar56 < iVar57));
              auVar74._8_4_ = -(uint)(iVar61 < iVar62);
              auVar74._12_4_ = -(uint)(iVar65 < iVar66);
              uStack_f0 = auVar74._8_8_;
              uStack_f0 = uStack_f0 | CONCAT44(-(uint)(iVar66 == iVar65),-(uint)(iVar62 == iVar61));
              auVar37._8_8_ = uStack_f0;
              auVar37._0_8_ =
                   auVar74._0_8_ | CONCAT44(-(uint)(iVar55 == iVar54),-(uint)(iVar57 == iVar56));
              if ((((((((((((((((auVar37 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar37 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar37 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar37 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar37 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar37 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar37 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (uStack_f0 >> 7 & 1) == 0) && (uStack_f0 >> 0xf & 1) == 0) &&
                      (uStack_f0 >> 0x17 & 1) == 0) && (uStack_f0 >> 0x1f & 1) == 0) &&
                    (uStack_f0 >> 0x27 & 1) == 0) && (uStack_f0 >> 0x2f & 1) == 0) &&
                  (uStack_f0 >> 0x37 & 1) == 0) && -1 < (long)uStack_f0) goto LAB_00a0ef67;
              vF_ext[1] = CONCAT44(iVar55,iVar57);
              vF[0] = CONCAT44(iVar66,iVar62);
              vH_1[1] = CONCAT44(-(uint)(iVar55 < iVar54),-(uint)(iVar57 < iVar56));
              cond[0] = CONCAT44(-(uint)(iVar66 < iVar65),-(uint)(iVar62 < iVar61));
              auVar18._8_8_ = cond[0];
              auVar18._0_8_ = vH_1[1];
              register0x00001240 = pblendvb(stack0xfffffffffffff118,auVar75,auVar18);
              auVar17._8_8_ = cond[0];
              auVar17._0_8_ = vH_1[1];
              register0x00001240 = pblendvb(stack0xfffffffffffff108,auVar76,auVar17);
              local_9b8 = (int)vH[1];
              iStack_9b4 = vH[1]._4_4_;
              iStack_9b0 = (int)vH[2];
              iStack_9ac = vH[2]._4_4_;
              auVar16._4_4_ = iStack_9b4 + 1;
              auVar16._0_4_ = local_9b8 + 1;
              auVar16._8_4_ = iStack_9b0 + 1;
              auVar16._12_4_ = iStack_9ac + 1;
              auVar15._4_4_ = iStack_884 + 1;
              auVar15._0_4_ = local_888 + 1;
              auVar15._8_4_ = iStack_880 + 1;
              auVar15._12_4_ = iStack_87c + 1;
              auVar14._8_8_ = cond[0];
              auVar14._0_8_ = vH_1[1];
              register0x00001240 = pblendvb(auVar16,auVar15,auVar14);
              tmp_6 = palVar45[k][0];
              vHp[0] = palVar45[k][1];
            }
          }
LAB_00a0ef67:
        }
        vH_1[0] = pvHLoad[iVar52][1];
        vHM_1[0] = pvHMLoad[iVar52][1];
        vHS_1[0] = pvHSLoad[iVar52][1];
        vHL_1[0] = pvHLLoad[iVar52][1];
        uStack_1048 = pvHLLoad[iVar52][0];
        vHL_1[1] = pvHSLoad[iVar52][0];
        vHS_1[1] = pvHMLoad[iVar52][0];
        vHM_1[1] = pvHLoad[iVar52][0];
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / iVar46) + 4U);
            end_query = end_query + 1) {
          vH_1[0] = vH_1[0] << 0x20 | (ulong)vHM_1[1] >> 0x20;
          vHM_1[0] = vHM_1[0] << 0x20 | (ulong)vHS_1[1] >> 0x20;
          vHS_1[0] = vHS_1[0] << 0x20 | (ulong)vHL_1[1] >> 0x20;
          vHL_1[0] = vHL_1[0] << 0x20 | uStack_1048 >> 0x20;
          uStack_1048 = uStack_1048 << 0x20;
          vHL_1[1] = vHL_1[1] << 0x20;
          vHS_1[1] = vHS_1[1] << 0x20;
          vHM_1[1] = vHM_1[1] << 0x20;
        }
        similar = vH_1[0]._4_4_;
        length = vHM_1[0]._4_4_;
        vNegLimit[1]._4_4_ = vHS_1[0]._4_4_;
        vNegLimit[1]._0_4_ = vHL_1[0]._4_4_;
        local_c8 = (int)vSaturationCheckMax[1];
        iStack_c4 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_c0 = (int)vSaturationCheckMin[0];
        iStack_bc = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_1f8 = (int)result;
        iStack_1f4 = (int)((ulong)result >> 0x20);
        iStack_1f0 = (int)vSaturationCheckMax[0];
        iStack_1ec = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar58 = CONCAT44(-(uint)(iStack_bc < local_104c),-(uint)(iStack_c0 < local_104c)) |
                 CONCAT44(-(uint)(iVar47 < iStack_1ec),-(uint)(iVar47 < iStack_1f0));
        auVar36._8_8_ = uVar58;
        auVar36._0_8_ =
             CONCAT44(-(uint)(iStack_c4 < local_104c),-(uint)(local_c8 < local_104c)) |
             CONCAT44(-(uint)(iVar47 < iStack_1f4),-(uint)(iVar47 < local_1f8));
        if ((((((((((((((((auVar36 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar36 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar36 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar36 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar36 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar36 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar58 >> 7 & 1) != 0) || (uVar58 >> 0xf & 1) != 0) || (uVar58 >> 0x17 & 1) != 0)
               || (uVar58 >> 0x1f & 1) != 0) || (uVar58 >> 0x27 & 1) != 0) ||
             (uVar58 >> 0x2f & 1) != 0) || (uVar58 >> 0x37 & 1) != 0) || (long)uVar58 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          similar = 0;
          length = 0;
          vNegLimit[1]._4_4_ = 0;
          vNegLimit[1]._0_4_ = 0;
          local_cd8 = 0;
          matrix._4_4_ = 0;
        }
        *(int32_t *)&_segNum->s1 = similar;
        *(int *)((long)&_segNum->s1 + 4) = local_cd8;
        _segNum->s1Len = matrix._4_4_;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->matches = length
        ;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->similar =
             vNegLimit[1]._4_4_;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->length =
             (int)vNegLimit[1];
        parasail_free(ptr_00);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLLoad);
        parasail_free(pvHLStore);
        parasail_free(pvHSLoad);
        parasail_free(pvHSStore);
        parasail_free(pvHMLoad);
        parasail_free(pvHMStore);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile32.score;
    vProfileM = (__m128i*)profile->profile32.matches;
    vProfileS = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);
        vHM = _mm_slli_si128(vHM, 4);
        vHS = _mm_slli_si128(vHS, 4);
        vHL = _mm_slli_si128(vHL, 4);

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi32(vH_dag, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi32(vH, vH_dag);
            case2 = _mm_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi32(vEL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vFL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 4);
            vF = _mm_slli_si128(vF, 4);
            vFM = _mm_slli_si128(vFM, 4);
            vFS = _mm_slli_si128(vFS, 4);
            vFL = _mm_slli_si128(vFL, 4);
            vHp = _mm_insert_epi32(vHp, boundary[j], 0);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            vFL = _mm_insert_epi32(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi32(vH, vHp);
                case2 = _mm_cmpeq_epi32(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi32(vFL, vOne),
                        _mm_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 4);
                vHM = _mm_slli_si128 (vHM, 4);
                vHS = _mm_slli_si128 (vHS, 4);
                vHL = _mm_slli_si128 (vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 4);
            vHM = _mm_slli_si128 (vHM, 4);
            vHS = _mm_slli_si128 (vHS, 4);
            vHL = _mm_slli_si128 (vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}